

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateRowsPS::DuplicateRowsPS(DuplicateRowsPS *this,DuplicateRowsPS *old)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  int32_t iVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_006b1018;
  (this->super_PostStep).m_name = (old->super_PostStep).m_name;
  iVar8 = (old->super_PostStep).nRows;
  (this->super_PostStep).nCols = (old->super_PostStep).nCols;
  (this->super_PostStep).nRows = iVar8;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (old->super_PostStep)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(old->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__DuplicateRowsPS_006b18a0;
  this->m_i = old->m_i;
  uVar1 = *(undefined8 *)(old->m_i_rowObj).m_backend.data._M_elems;
  uVar2 = *(undefined8 *)((old->m_i_rowObj).m_backend.data._M_elems + 2);
  uVar3 = *(undefined8 *)((old->m_i_rowObj).m_backend.data._M_elems + 4);
  uVar4 = *(undefined8 *)((old->m_i_rowObj).m_backend.data._M_elems + 6);
  uVar5 = *(undefined8 *)((old->m_i_rowObj).m_backend.data._M_elems + 8);
  uVar6 = *(undefined8 *)((old->m_i_rowObj).m_backend.data._M_elems + 10);
  uVar7 = *(undefined8 *)((old->m_i_rowObj).m_backend.data._M_elems + 0xe);
  *(undefined8 *)((this->m_i_rowObj).m_backend.data._M_elems + 0xc) =
       *(undefined8 *)((old->m_i_rowObj).m_backend.data._M_elems + 0xc);
  *(undefined8 *)((this->m_i_rowObj).m_backend.data._M_elems + 0xe) = uVar7;
  *(undefined8 *)((this->m_i_rowObj).m_backend.data._M_elems + 8) = uVar5;
  *(undefined8 *)((this->m_i_rowObj).m_backend.data._M_elems + 10) = uVar6;
  *(undefined8 *)((this->m_i_rowObj).m_backend.data._M_elems + 4) = uVar3;
  *(undefined8 *)((this->m_i_rowObj).m_backend.data._M_elems + 6) = uVar4;
  *(undefined8 *)(this->m_i_rowObj).m_backend.data._M_elems = uVar1;
  *(undefined8 *)((this->m_i_rowObj).m_backend.data._M_elems + 2) = uVar2;
  (this->m_i_rowObj).m_backend.exp = (old->m_i_rowObj).m_backend.exp;
  (this->m_i_rowObj).m_backend.neg = (old->m_i_rowObj).m_backend.neg;
  iVar9 = (old->m_i_rowObj).m_backend.prec_elem;
  iVar8 = old->m_maxLhsIdx;
  iVar10 = old->m_minRhsIdx;
  (this->m_i_rowObj).m_backend.fpclass = (old->m_i_rowObj).m_backend.fpclass;
  (this->m_i_rowObj).m_backend.prec_elem = iVar9;
  this->m_maxLhsIdx = iVar8;
  this->m_minRhsIdx = iVar10;
  bVar11 = old->m_isFirst;
  bVar12 = old->m_isLast;
  bVar13 = old->m_fixed;
  this->m_maxSense = old->m_maxSense;
  this->m_isFirst = bVar11;
  this->m_isLast = bVar12;
  this->m_fixed = bVar13;
  this->m_nCols = old->m_nCols;
  (this->m_scale).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_scale).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_scale).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_scale)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006b0b50;
  (this->m_scale).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_scale,
             (old->m_scale).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->m_scale).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,&(old->m_scale).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
  (this->m_rowObj).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_rowObj).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_rowObj).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_rowObj)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006b0b50;
  (this->m_rowObj).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_rowObj,
             (old->m_rowObj).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->m_rowObj).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,&(old->m_rowObj).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
  DataArray<int>::DataArray(&this->m_rIdxLocalOld,&old->m_rIdxLocalOld);
  DataArray<int>::DataArray(&this->m_perm,&old->m_perm);
  DataArray<bool>::DataArray(&this->m_isLhsEqualRhs,&old->m_isLhsEqualRhs);
  return;
}

Assistant:

DuplicateRowsPS(const DuplicateRowsPS& old)
         : PostStep(old)
         , m_i(old.m_i)
         , m_i_rowObj(old.m_i_rowObj)
         , m_maxLhsIdx(old.m_maxLhsIdx)
         , m_minRhsIdx(old.m_minRhsIdx)
         , m_maxSense(old.m_maxSense)
         , m_isFirst(old.m_isFirst)
         , m_isLast(old.m_isLast)
         , m_fixed(old.m_fixed)
         , m_nCols(old.m_nCols)
         , m_scale(old.m_scale)
         , m_rowObj(old.m_rowObj)
         , m_rIdxLocalOld(old.m_rIdxLocalOld)
         , m_perm(old.m_perm)
         , m_isLhsEqualRhs(old.m_isLhsEqualRhs)
      {}